

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O0

uint32_t Ngram_next_words(Ngram model,uint32_t *context,uint32_t context_len,
                         uint32_t next_word_limit,NextWordResult_T *rets)

{
  LowGram_T *pLVar1;
  void *__base;
  LowGram_T *pLVar2;
  HighGram_T *pHVar3;
  uint32_t local_9c;
  NextWordResult_T *local_98;
  size_t i_3;
  HighGram_T *gram_1;
  size_t i_2;
  LowGram_T *gram;
  size_t i_1;
  NextWordResult_T *word_results;
  size_t arr_real_size;
  size_t arr_size;
  uint local_50;
  uint32_t j;
  uint32_t ngram_idx;
  uint32_t next;
  uint32_t next_word_end;
  uint32_t next_word_start;
  uint32_t cur_word_id;
  uint32_t i;
  uint32_t res_num;
  uint32_t start;
  NextWordResult_T *rets_local;
  uint32_t next_word_limit_local;
  uint32_t context_len_local;
  uint32_t *context_local;
  Ngram model_local;
  
  if (context_len == 0) {
    model_local._4_4_ = 0;
  }
  else {
    if (context_len < model->ngram_order) {
      local_9c = 0;
    }
    else {
      local_9c = (context_len - model->ngram_order) + 1;
    }
    cur_word_id = 0;
    for (next_word_start = local_9c; next_word_start < context_len;
        next_word_start = next_word_start + 1) {
      next = model->uni_gram[context[next_word_start]].next_arr_idx;
      ngram_idx = model->uni_gram[context[next_word_start] + 1].next_arr_idx;
      j = 0xffffffff;
      local_50 = 0;
      arr_size._4_4_ = next_word_start;
      while (arr_size._4_4_ = arr_size._4_4_ + 1, arr_size._4_4_ < context_len) {
        j = search_low_gram(context[arr_size._4_4_],model->low_grams[local_50] + next,
                            (ulong)(ngram_idx - next));
        local_50 = local_50 + 1;
        if (j == 0xffffffff) break;
        next = model->low_grams[local_50][j].next_arr_idx;
        ngram_idx = model->low_grams[local_50][j + 1].next_arr_idx;
      }
      if (j != 0xffffffff) {
        pLVar1 = (LowGram_T *)(ulong)(ngram_idx - next);
        word_results = (NextWordResult_T *)0x0;
        __base = malloc((long)pLVar1 << 3);
        if (local_50 + 2 == model->ngram_order) {
          for (gram_1 = (HighGram_T *)0x0; gram_1 < pLVar1;
              gram_1 = (HighGram_T *)((long)&gram_1->word + 1)) {
            pHVar3 = model->high_gram + (long)&gram_1->word + (ulong)next;
            if (pHVar3->prob != 0xffffffff) {
              *(uint32_t *)((long)__base + (long)word_results * 8) = pHVar3->word;
              *(uint32_t *)((long)__base + (long)word_results * 8 + 4) = pHVar3->prob;
              word_results = (NextWordResult_T *)((long)&word_results->word_id + 1);
            }
          }
        }
        else {
          for (gram = (LowGram_T *)0x0; gram < pLVar1; gram = (LowGram_T *)((long)&gram->word + 1))
          {
            pLVar2 = model->low_grams[local_50] + (long)&gram->word + (ulong)next;
            if (pLVar2->prob != 0xffffffff) {
              *(uint32_t *)((long)__base + (long)word_results * 8) = pLVar2->word;
              *(uint32_t *)((long)__base + (long)word_results * 8 + 4) = pLVar2->prob;
              word_results = (NextWordResult_T *)((long)&word_results->word_id + 1);
            }
          }
        }
        qsort(__base,(size_t)word_results,8,next_word_cmp);
        for (local_98 = (NextWordResult_T *)0x0; local_98 < word_results;
            local_98 = (NextWordResult_T *)((long)&local_98->word_id + 1)) {
          rets[cur_word_id] = *(NextWordResult_T *)((long)__base + (long)local_98 * 8);
          if (next_word_limit <= cur_word_id + 1) {
            free(__base);
            return next_word_limit;
          }
          cur_word_id = cur_word_id + 1;
        }
        free(__base);
      }
    }
    model_local._4_4_ = cur_word_id;
  }
  return model_local._4_4_;
}

Assistant:

uint32_t Ngram_next_words(const Ngram model, const uint32_t* context, uint32_t context_len, uint32_t next_word_limit, NextWordResult_T* rets){
    if (context_len == 0) {
        return 0;
    }
    uint32_t start = (context_len >= model->ngram_order) ? (context_len - model->ngram_order + 1): 0;
    uint32_t res_num = 0;
    for (uint32_t i = start; i < context_len; i++) {
        uint32_t cur_word_id = context[i];
        uint32_t next_word_start = model->uni_gram[cur_word_id].next_arr_idx;
        uint32_t next_word_end = model->uni_gram[cur_word_id+1].next_arr_idx;
        uint32_t next = -1;
        uint32_t ngram_idx = 0;
        for (uint32_t j = i+1; j < context_len;j++) {
            next = search_low_gram(context[j], model->low_grams[ngram_idx] + next_word_start, next_word_end - next_word_start);
            ngram_idx+=1;
            if (next == -1) {
                break;
            }else{
                next_word_start = model->low_grams[ngram_idx][next].next_arr_idx;
                next_word_end = model->low_grams[ngram_idx][next+1].next_arr_idx;
            }
        }
        if (next != -1) {
            //have found
            size_t arr_size = next_word_end - next_word_start;
            size_t arr_real_size = 0;
            NextWordResult_T* word_results = malloc(sizeof(NextWordResult_T)*arr_size);
            if (ngram_idx+2 != model->ngram_order) {
                //in low gram array
                for (size_t i = 0; i < arr_size; i++) {
                    LowGram_T* gram = &model->low_grams[ngram_idx][next_word_start+i];
                    if (gram->prob != (uint32_t)-1) {//srilm's bug
                        word_results[arr_real_size].word_id = gram->word; 
                        word_results[arr_real_size].prob = gram->prob;
                        arr_real_size++;
                    }
                }
            }else{
                //in high gram array
                for (size_t i = 0; i < arr_size; i++) {
                    HighGram_T* gram = &model->high_gram[next_word_start+i];
                    if (gram->prob != (uint32_t)-1) {
                        word_results[arr_real_size].word_id = gram->word; 
                        word_results[arr_real_size].prob = gram->prob;
                        arr_real_size++;
                    }
                }
            }
            qsort(word_results,arr_real_size, sizeof(NextWordResult_T), next_word_cmp);
            //copy to dst
            //if enough, then break
            for (size_t i = 0;i< arr_real_size;i++) {
                rets[res_num++] = word_results[i];
                if (res_num >= next_word_limit) {
                    free(word_results);
                    return next_word_limit;
                }
            }
            free(word_results);
        }
    }
    return res_num;
}